

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walIndexRecover(Wal *pWal)

{
  int iVar1;
  u32 uVar2;
  u32 uVar3;
  WalCkptInfo *pWVar4;
  int local_a4;
  int i;
  WalCkptInfo *pInfo;
  u32 nTruncate;
  u32 pgno;
  int isValid;
  u32 version;
  u32 magic;
  int szPage;
  i64 iOffset;
  u8 *puStack_70;
  int iFrame;
  u8 *aData;
  u8 *puStack_60;
  int szFrame;
  u8 *aFrame;
  u8 aBuf [32];
  int nLock;
  int iLock;
  u32 aFrameCksum [2];
  i64 nSize;
  int rc;
  Wal *pWal_local;
  
  memset(&nLock,0,8);
  aBuf._28_4_ = pWal->ckptLock + 1;
  aBuf._24_4_ = 8 - aBuf._28_4_;
  iVar1 = walLockExclusive(pWal,aBuf._28_4_,aBuf._24_4_);
  if (iVar1 != 0) {
    return iVar1;
  }
  memset(&pWal->hdr,0,0x30);
  nSize._4_4_ = sqlite3OsFileSize(pWal->pWalFd,(i64 *)aFrameCksum);
  if (nSize._4_4_ == 0) {
    if (0x20 < (long)aFrameCksum) {
      puStack_60 = (u8 *)0x0;
      nSize._4_4_ = sqlite3OsRead(pWal->pWalFd,&aFrame,0x20,0);
      if (nSize._4_4_ != 0) goto LAB_0012c6a7;
      isValid = sqlite3Get4byte((u8 *)&aFrame);
      version = sqlite3Get4byte(aBuf);
      if (((((isValid & 0xfffffffeU) == 0x377f0682) && ((version & version - 1) == 0)) &&
          ((int)version < 0x10001)) && (0x1ff < (int)version)) {
        (pWal->hdr).bigEndCksum = (byte)isValid & 1;
        pWal->szPage = version;
        uVar2 = sqlite3Get4byte(aBuf + 4);
        pWal->nCkpt = uVar2;
        *(undefined8 *)(pWal->hdr).aSalt = aBuf._8_8_;
        walChecksumBytes((uint)((pWal->hdr).bigEndCksum == '\0'),(u8 *)&aFrame,0x18,(u32 *)0x0,
                         (pWal->hdr).aFrameCksum);
        uVar2 = (pWal->hdr).aFrameCksum[0];
        uVar3 = sqlite3Get4byte(aBuf + 0x10);
        if ((uVar2 == uVar3) &&
           (uVar2 = (pWal->hdr).aFrameCksum[1], uVar3 = sqlite3Get4byte(aBuf + 0x14), uVar2 == uVar3
           )) {
          pgno = sqlite3Get4byte((u8 *)((long)&aFrame + 4));
          if (pgno == 0x2de218) {
            aData._4_4_ = version + 0x18;
            puStack_60 = (u8 *)sqlite3_malloc64((long)aData._4_4_);
            if (puStack_60 == (u8 *)0x0) {
              nSize._4_4_ = 7;
              goto LAB_0012c6a7;
            }
            puStack_70 = puStack_60 + 0x18;
            iOffset._4_4_ = 0;
            for (_magic = 0x20; _magic + aData._4_4_ <= (long)aFrameCksum;
                _magic = aData._4_4_ + _magic) {
              iOffset._4_4_ = iOffset._4_4_ + 1;
              nSize._4_4_ = sqlite3OsRead(pWal->pWalFd,puStack_60,aData._4_4_,_magic);
              if (((nSize._4_4_ != 0) ||
                  (nTruncate = walDecodeFrame(pWal,(u32 *)((long)&pInfo + 4),(u32 *)&pInfo,
                                              puStack_70,puStack_60), nTruncate == 0)) ||
                 (nSize._4_4_ = walIndexAppend(pWal,iOffset._4_4_,pInfo._4_4_), nSize._4_4_ != 0))
              break;
              if ((u32)pInfo != 0) {
                (pWal->hdr).mxFrame = iOffset._4_4_;
                (pWal->hdr).nPage = (u32)pInfo;
                (pWal->hdr).szPage = (ushort)version & 0xff00 | (ushort)(version >> 0x10);
                nLock = (pWal->hdr).aFrameCksum[0];
                iLock = (pWal->hdr).aFrameCksum[1];
              }
            }
            sqlite3_free(puStack_60);
          }
          else {
            nSize._4_4_ = sqlite3CantopenError(0xd8af);
          }
        }
      }
    }
    if (nSize._4_4_ == 0) {
      (pWal->hdr).aFrameCksum[0] = nLock;
      (pWal->hdr).aFrameCksum[1] = iLock;
      walIndexWriteHdr(pWal);
      pWVar4 = walCkptInfo(pWal);
      pWVar4->nBackfill = 0;
      pWVar4->nBackfillAttempted = (pWal->hdr).mxFrame;
      pWVar4->aReadMark[0] = 0;
      for (local_a4 = 1; local_a4 < 5; local_a4 = local_a4 + 1) {
        pWVar4->aReadMark[local_a4] = 0xffffffff;
      }
      if ((pWal->hdr).mxFrame != 0) {
        pWVar4->aReadMark[1] = (pWal->hdr).mxFrame;
      }
      if ((pWal->hdr).nPage != 0) {
        sqlite3_log(0x11b,"recovered %d frames from WAL file %s",(ulong)(pWal->hdr).mxFrame,
                    pWal->zWalName);
      }
    }
  }
LAB_0012c6a7:
  walUnlockExclusive(pWal,aBuf._28_4_,aBuf._24_4_);
  return nSize._4_4_;
}

Assistant:

static int walIndexRecover(Wal *pWal){
  int rc;                         /* Return Code */
  i64 nSize;                      /* Size of log file */
  u32 aFrameCksum[2] = {0, 0};
  int iLock;                      /* Lock offset to lock for checkpoint */
  int nLock;                      /* Number of locks to hold */

  /* Obtain an exclusive lock on all byte in the locking range not already
  ** locked by the caller. The caller is guaranteed to have locked the
  ** WAL_WRITE_LOCK byte, and may have also locked the WAL_CKPT_LOCK byte.
  ** If successful, the same bytes that are locked here are unlocked before
  ** this function returns.
  */
  assert( pWal->ckptLock==1 || pWal->ckptLock==0 );
  assert( WAL_ALL_BUT_WRITE==WAL_WRITE_LOCK+1 );
  assert( WAL_CKPT_LOCK==WAL_ALL_BUT_WRITE );
  assert( pWal->writeLock );
  iLock = WAL_ALL_BUT_WRITE + pWal->ckptLock;
  nLock = SQLITE_SHM_NLOCK - iLock;
  rc = walLockExclusive(pWal, iLock, nLock);
  if( rc ){
    return rc;
  }
  WALTRACE(("WAL%p: recovery begin...\n", pWal));

  memset(&pWal->hdr, 0, sizeof(WalIndexHdr));

  rc = sqlite3OsFileSize(pWal->pWalFd, &nSize);
  if( rc!=SQLITE_OK ){
    goto recovery_error;
  }

  if( nSize>WAL_HDRSIZE ){
    u8 aBuf[WAL_HDRSIZE];         /* Buffer to load WAL header into */
    u8 *aFrame = 0;               /* Malloc'd buffer to load entire frame */
    int szFrame;                  /* Number of bytes in buffer aFrame[] */
    u8 *aData;                    /* Pointer to data part of aFrame buffer */
    int iFrame;                   /* Index of last frame read */
    i64 iOffset;                  /* Next offset to read from log file */
    int szPage;                   /* Page size according to the log */
    u32 magic;                    /* Magic value read from WAL header */
    u32 version;                  /* Magic value read from WAL header */
    int isValid;                  /* True if this frame is valid */

    /* Read in the WAL header. */
    rc = sqlite3OsRead(pWal->pWalFd, aBuf, WAL_HDRSIZE, 0);
    if( rc!=SQLITE_OK ){
      goto recovery_error;
    }

    /* If the database page size is not a power of two, or is greater than
    ** SQLITE_MAX_PAGE_SIZE, conclude that the WAL file contains no valid 
    ** data. Similarly, if the 'magic' value is invalid, ignore the whole
    ** WAL file.
    */
    magic = sqlite3Get4byte(&aBuf[0]);
    szPage = sqlite3Get4byte(&aBuf[8]);
    if( (magic&0xFFFFFFFE)!=WAL_MAGIC 
     || szPage&(szPage-1) 
     || szPage>SQLITE_MAX_PAGE_SIZE 
     || szPage<512 
    ){
      goto finished;
    }
    pWal->hdr.bigEndCksum = (u8)(magic&0x00000001);
    pWal->szPage = szPage;
    pWal->nCkpt = sqlite3Get4byte(&aBuf[12]);
    memcpy(&pWal->hdr.aSalt, &aBuf[16], 8);

    /* Verify that the WAL header checksum is correct */
    walChecksumBytes(pWal->hdr.bigEndCksum==SQLITE_BIGENDIAN, 
        aBuf, WAL_HDRSIZE-2*4, 0, pWal->hdr.aFrameCksum
    );
    if( pWal->hdr.aFrameCksum[0]!=sqlite3Get4byte(&aBuf[24])
     || pWal->hdr.aFrameCksum[1]!=sqlite3Get4byte(&aBuf[28])
    ){
      goto finished;
    }

    /* Verify that the version number on the WAL format is one that
    ** are able to understand */
    version = sqlite3Get4byte(&aBuf[4]);
    if( version!=WAL_MAX_VERSION ){
      rc = SQLITE_CANTOPEN_BKPT;
      goto finished;
    }

    /* Malloc a buffer to read frames into. */
    szFrame = szPage + WAL_FRAME_HDRSIZE;
    aFrame = (u8 *)sqlite3_malloc64(szFrame);
    if( !aFrame ){
      rc = SQLITE_NOMEM_BKPT;
      goto recovery_error;
    }
    aData = &aFrame[WAL_FRAME_HDRSIZE];

    /* Read all frames from the log file. */
    iFrame = 0;
    for(iOffset=WAL_HDRSIZE; (iOffset+szFrame)<=nSize; iOffset+=szFrame){
      u32 pgno;                   /* Database page number for frame */
      u32 nTruncate;              /* dbsize field from frame header */

      /* Read and decode the next log frame. */
      iFrame++;
      rc = sqlite3OsRead(pWal->pWalFd, aFrame, szFrame, iOffset);
      if( rc!=SQLITE_OK ) break;
      isValid = walDecodeFrame(pWal, &pgno, &nTruncate, aData, aFrame);
      if( !isValid ) break;
      rc = walIndexAppend(pWal, iFrame, pgno);
      if( rc!=SQLITE_OK ) break;

      /* If nTruncate is non-zero, this is a commit record. */
      if( nTruncate ){
        pWal->hdr.mxFrame = iFrame;
        pWal->hdr.nPage = nTruncate;
        pWal->hdr.szPage = (u16)((szPage&0xff00) | (szPage>>16));
        testcase( szPage<=32768 );
        testcase( szPage>=65536 );
        aFrameCksum[0] = pWal->hdr.aFrameCksum[0];
        aFrameCksum[1] = pWal->hdr.aFrameCksum[1];
      }
    }

    sqlite3_free(aFrame);
  }

finished:
  if( rc==SQLITE_OK ){
    volatile WalCkptInfo *pInfo;
    int i;
    pWal->hdr.aFrameCksum[0] = aFrameCksum[0];
    pWal->hdr.aFrameCksum[1] = aFrameCksum[1];
    walIndexWriteHdr(pWal);

    /* Reset the checkpoint-header. This is safe because this thread is 
    ** currently holding locks that exclude all other readers, writers and
    ** checkpointers.
    */
    pInfo = walCkptInfo(pWal);
    pInfo->nBackfill = 0;
    pInfo->nBackfillAttempted = pWal->hdr.mxFrame;
    pInfo->aReadMark[0] = 0;
    for(i=1; i<WAL_NREADER; i++) pInfo->aReadMark[i] = READMARK_NOT_USED;
    if( pWal->hdr.mxFrame ) pInfo->aReadMark[1] = pWal->hdr.mxFrame;

    /* If more than one frame was recovered from the log file, report an
    ** event via sqlite3_log(). This is to help with identifying performance
    ** problems caused by applications routinely shutting down without
    ** checkpointing the log file.
    */
    if( pWal->hdr.nPage ){
      sqlite3_log(SQLITE_NOTICE_RECOVER_WAL,
          "recovered %d frames from WAL file %s",
          pWal->hdr.mxFrame, pWal->zWalName
      );
    }
  }

recovery_error:
  WALTRACE(("WAL%p: recovery %s\n", pWal, rc ? "failed" : "ok"));
  walUnlockExclusive(pWal, iLock, nLock);
  return rc;
}